

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseAnyRejectElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAnyRejectElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *errors,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper)

{
  ScriptContext *scriptContext;
  DynamicObject *prototype;
  JavascriptMethod entryPoint_00;
  ScriptContext **ppSVar1;
  DynamicObject **ppDVar2;
  DynamicTypeHandler *typeHandler;
  Recycler *pRVar3;
  JavascriptPromiseAnyRejectElementFunction *this_00;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_79;
  TrackAllocData local_78;
  JavascriptPromiseAnyRejectElementFunction *function;
  DynamicType *type;
  FunctionInfo *functionInfo;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements_local;
  JavascriptPromiseCapability *capabilities_local;
  JavascriptArray *errors_local;
  JavascriptMethod p_Stack_18;
  uint32 index_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)JavascriptPromise::EntryInfo::AnyRejectElementFunction;
  functionInfo = (FunctionInfo *)remainingElements;
  remainingElements_local =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)capabilities;
  capabilities_local = (JavascriptPromiseCapability *)errors;
  errors_local._4_4_ = index;
  p_Stack_18 = entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = p_Stack_18;
  prototype = *ppDVar2;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  function = (JavascriptPromiseAnyRejectElementFunction *)
             DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                              entryPoint_00,typeHandler,false,false);
  pRVar3 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&JavascriptPromiseAnyRejectElementFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a08);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_78);
  this_00 = (JavascriptPromiseAnyRejectElementFunction *)
            new<(Memory::ObjectInfoBits)1>(0x70,pRVar3,&local_79);
  JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction
            (this_00,(DynamicType *)function,(FunctionInfo *)type,errors_local._4_4_,
             (JavascriptArray *)capabilities_local,
             (JavascriptPromiseCapability *)remainingElements_local,
             (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)functionInfo,
             alreadyCalledWrapper);
  return this_00;
}

Assistant:

JavascriptPromiseAnyRejectElementFunction* JavascriptLibrary::CreatePromiseAnyRejectElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* errors, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AnyRejectElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAnyRejectElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAnyRejectElementFunction, type, functionInfo, index, errors, capabilities, remainingElements, alreadyCalledWrapper);
        // Length should be 1 but not accessible from script.
        return function;
    }